

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::deinit
          (GeometryShaderInvalidArrayedInputVariablesTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  deinitSOs(this);
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_po_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x448))();
    this->m_po_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderInvalidArrayedInputVariablesTest::deinit()
{
	deinitSOs();

	/* Release the PO */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}